

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O1

string * __thiscall
testing::internal::StreamableToString<wchar_t*>
          (string *__return_storage_ptr__,internal *this,wchar_t **streamable)

{
  stringstream *in_RAX;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  local_28.ptr_ = in_RAX;
  Message::Message((Message *)&local_28);
  Message::operator<<((Message *)&local_28,*(wchar_t **)this);
  StringStreamToString(__return_storage_ptr__,local_28.ptr_);
  if (local_28.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_28.ptr_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}